

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_image_extract_palette_to_buffer(rf_image image,rf_color *palette_dst,rf_int palette_size)

{
  long lVar1;
  int iVar2;
  rf_color rVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    if (palette_size < 1) {
      rf_log_impl(4,0x17ae3a);
    }
    else {
      iVar2 = rf_bits_per_pixel(image.format);
      iVar2 = iVar2 * image.height * image.width;
      iVar4 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar4 = iVar2;
      }
      if (7 < iVar2) {
        lVar1 = *(long *)(&DAT_0017a6c0 + (long)(int)image.format * 8);
        lVar7 = 0;
        lVar6 = 0;
        do {
          rVar3 = rf_format_one_pixel_to_rgba32(image.data,image.format);
          if (0 < lVar6) {
            lVar5 = 0;
            do {
              if (palette_dst[lVar5] == rVar3) goto LAB_0012619d;
              lVar5 = lVar5 + 1;
            } while (lVar6 != lVar5);
          }
          palette_dst[lVar6] = rVar3;
          lVar6 = lVar6 + 1;
LAB_0012619d:
          lVar7 = lVar7 + lVar1;
        } while ((lVar7 < iVar4 >> 3) && (lVar6 < palette_size));
      }
    }
  }
  else {
    rf_log_impl(8,0x17ad10,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_extract_palette_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3bff;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return;
}

Assistant:

RF_API void rf_image_extract_palette_to_buffer(rf_image image, rf_color* palette_dst, rf_int palette_size)
{
    if (rf_is_uncompressed_format(image.format))
    {
        if (palette_size > 0)
        {
            int img_size = rf_image_size(image);
            int img_bpp  = rf_bytes_per_pixel(image.format);
            const unsigned char* img_data = (unsigned char*) image.data;

            for (rf_int img_iter = 0, palette_iter = 0; img_iter < img_size && palette_iter < palette_size; img_iter += img_bpp)
            {
                rf_color color = rf_format_one_pixel_to_rgba32(img_data, image.format);

                bool color_found = false;

                for (rf_int i = 0; i < palette_iter; i++)
                {
                    if (rf_color_match(palette_dst[i], color))
                    {
                        color_found = true;
                        break;
                    }
                }

                if (!color_found)
                {
                    palette_dst[palette_iter] = color;
                    palette_iter++;
                }
            }
        }
        else RF_LOG(RF_LOG_TYPE_WARNING, "Palette size was 0.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);
}